

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  _Bool _Var1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long in_RSI;
  undefined8 *puVar6;
  int in_EDI;
  undefined8 *puVar7;
  byte bVar8;
  char *buf;
  int tunfd;
  ev_api *api;
  int err;
  handler dns_handler;
  handler i2cp_handler;
  handler tun_handler;
  trans2p t;
  char *fname;
  undefined4 in_stack_ffffffffff8ab058;
  int in_stack_ffffffffff8ab05c;
  undefined4 in_stack_ffffffffff8ab060;
  int in_stack_ffffffffff8ab064;
  int *in_stack_ffffffffff8ab068;
  int in_stack_ffffffffff8ab070;
  int in_stack_ffffffffff8ab074;
  char *in_stack_ffffffffff8ab078;
  size_t in_stack_ffffffffff8ab080;
  char *in_stack_ffffffffff8ab088;
  trans2p *in_stack_ffffffffff8ab090;
  i2cp_state *in_stack_ffffffffff8ab160;
  byte in_stack_ffffffffff8acae4;
  uint in_stack_ffffffffff8acbe8;
  uint in_stack_ffffffffff8accec;
  byte in_stack_ffffffffff8accf0;
  code *in_stack_ffffffffff8acd00;
  code *in_stack_ffffffffff8acd10;
  code *in_stack_ffffffffff8acd18;
  code *in_stack_ffffffffff8acd28;
  undefined4 in_stack_ffffffffffcbde88;
  undefined1 auStack_10018 [65536];
  char *local_18;
  uint local_4;
  
  bVar8 = 0;
  local_18 = "default.ini";
  if (1 < in_EDI) {
    local_18 = *(char **)(in_RSI + 8);
  }
  memset(&stack0xffffffffff8ac1c0,0,0x818);
  memset(&stack0xffffffffff8ab9a8,0,0x818);
  memset(&stack0xffffffffff8ab190,0,0x818);
  config_init_default((trans2p_config *)0x114b33);
  local_4 = ini_parse(in_stack_ffffffffff8ab078,
                      (ini_handler)CONCAT44(in_stack_ffffffffff8ab074,in_stack_ffffffffff8ab070),
                      in_stack_ffffffffff8ab068);
  if (local_4 == 0) {
    iVar2 = udp_socket();
    if (iVar2 == -1) {
      __assert_fail("t.dns.ev.fd != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                    ,0x1a2,"int main(int, char **)");
    }
    printf("binding dns server to %s:%d\n",&stack0xffffffffff8acae8,(ulong)in_stack_ffffffffff8acbe8
          );
    _Var1 = udp_bind(in_stack_ffffffffff8ab070,(char *)in_stack_ffffffffff8ab068,
                     in_stack_ffffffffff8ab064);
    if (_Var1) {
      dns_state_init((dns_state *)0x114cac);
      addr_mapper_init((addr_mapper *)&stack0xffffffffffcce630,(in_addr *)&stack0xffffffffff8acadc,
                       (in_addr *)&stack0xffffffffff8acae0);
      i2p_crypto_init();
      i2cp_state_init((i2cp_state *)CONCAT44(in_stack_ffffffffff8ab064,in_stack_ffffffffff8ab060),
                      (i2cp_write_handler)
                      CONCAT44(in_stack_ffffffffff8ab05c,in_stack_ffffffffff8ab058),(void *)0x114d06
                     );
      i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd60,'!',onsetdate,
                          &stack0xffffffffff8ac9d8);
      i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd60,'\x14',onsessionstatus,
                          &stack0xffffffffff8ac9d8);
      i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd60,'%',onreqvarls,
                          &stack0xffffffffff8ac9d8);
      i2cp_set_msghandler((i2cp_state *)&stack0xffffffffff8acd60,'\x1f',onpayload,
                          &stack0xffffffffff8ac9d8);
      _Var1 = ev_init((ev_api *)0x114dba);
      if (!_Var1) {
        __assert_fail("ev_init(&t.api)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1b6,"int main(int, char **)");
      }
      lVar3 = (*in_stack_ffffffffff8acd00)();
      if (lVar3 != 0) {
        (*in_stack_ffffffffff8acd10)(lVar3,&stack0xffffffffffcefe40);
        if ((in_stack_ffffffffff8acae4 & 1) == 0) {
          printf("tun interface disabled\n");
        }
        else {
          printf("open tun interface %s\n",&stack0xffffffffff8ac9d8);
          puVar6 = (undefined8 *)&stack0xffffffffff8ac9d8;
          puVar7 = (undefined8 *)&stack0xffffffffff8ab058;
          for (lVar5 = 0x22; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar7 = *puVar6;
            puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
            puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
          }
          iVar2 = (*in_stack_ffffffffff8acd28)(lVar3);
          if (iVar2 == -1) {
            printf("failed to open %s\n",&stack0xffffffffff8ac9d8);
            return 1;
          }
          tunif_init((tunif *)CONCAT44(in_stack_ffffffffff8ab064,in_stack_ffffffffff8ab060),
                     in_stack_ffffffffff8ab05c);
          (*in_stack_ffffffffff8acd10)(lVar3,&stack0xffffffffffceff68);
        }
        while( true ) {
          while( true ) {
            while( true ) {
              printf("generate new identity\n");
              i2p_keygen((i2p_privkeybuf *)0x114f8f);
              i2p_privkey_dest((i2p_privkeybuf *)
                               CONCAT44(in_stack_ffffffffff8ab064,in_stack_ffffffffff8ab060),
                               (i2p_dest *)
                               CONCAT44(in_stack_ffffffffff8ab05c,in_stack_ffffffffff8ab058));
              i2p_dest_tob32addr((i2p_dest *)in_stack_ffffffffff8ab090,in_stack_ffffffffff8ab088,
                                 in_stack_ffffffffff8ab080);
              printf("we are %s\n",auStack_10018);
              if ((in_stack_ffffffffff8accf0 & 1) != 0) break;
              mainloop(in_stack_ffffffffff8ab090);
            }
            printf("connecting to i2p router at %s port %d\n",&stack0xffffffffff8acbec,
                   (ulong)in_stack_ffffffffff8accec);
            _Var1 = blocking_tcp_connect
                              (in_stack_ffffffffff8ab078,in_stack_ffffffffff8ab074,
                               in_stack_ffffffffff8ab068);
            if (_Var1) break;
            perror("blocking_tcp_connect()");
            sleep(1);
          }
          uVar4 = (*in_stack_ffffffffff8acd10)(lVar3,&stack0xffffffffff8acd30);
          if ((uVar4 & 1) == 0) break;
          i2cp_begin(in_stack_ffffffffff8ab160);
          mainloop(in_stack_ffffffffff8ab090);
          (*in_stack_ffffffffff8acd18)(lVar3,in_stack_ffffffffffcbde88);
        }
        __assert_fail("api->add(t.impl, &t.i2cp_ev)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                      ,0x1dd,"int main(int, char **)");
      }
      __assert_fail("t.impl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/majestrate[P]trans2p/src/main.c"
                    ,0x1ba,"int main(int, char **)");
    }
    printf("failed to bind udp socket for dns at %s %d\n",&stack0xffffffffff8acae8,
           (ulong)in_stack_ffffffffff8acbe8);
    local_4 = 0xffffffff;
  }
  else if (local_4 == 0xffffffff) {
    printf("cannot open %s\n",local_18);
  }
  else if (local_4 == 0xfffffffe) {
    printf("alloc error\n");
  }
  else {
    printf("error %d\n",(ulong)local_4);
  }
  return local_4;
}

Assistant:

int main(int argc, char * argv[])
{
  const char * fname = "default.ini";


  if(argc > 1)
    fname = argv[1];
  
  struct trans2p t;

  struct handler tun_handler = {
    .t = &t,
    .read = &tun_onpacket,
    .write = &tun_flushwrite
  };
  
  struct handler i2cp_handler = {
    .t = &t,
    .read = &i2cp_onread,
    .write = NULL
  };

  struct handler dns_handler = {
    .t = &t,
    .read = &dns_onread,
    .write = NULL
  };
  
  config_init_default(&t.config);

  int err = ini_parse(fname, &iter_config, &t.config);
  if (err != 0)
  {
    if(err == -1)
      printf("cannot open %s\n", fname);
    else if(err == -2)
      printf("alloc error\n");
    else
      printf("error %d\n", err);
    return err;
  }

  t.dns.ev.flags = EV_READ;
  t.dns.ev.ptr = &dns_handler;
  t.dns.ev.fd = udp_socket();
  assert(t.dns.ev.fd != -1);
  printf("binding dns server to %s:%d\n", t.config.dns.addr, t.config.dns.port);
  if(!udp_bind(t.dns.ev.fd, t.config.dns.addr, t.config.dns.port))
  {
    printf("failed to bind udp socket for dns at %s %d\n", t.config.dns.addr, t.config.dns.port);
    return -1;
  }
  dns_state_init(&t.dns);

  addr_mapper_init(&t.dns.addr, &t.config.tun.addr, &t.config.tun.netmask);
  
  i2p_crypto_init();
  i2cp_state_init(&t.i2cp, &i2cp_write, &t);

  i2cp_set_msghandler(&t.i2cp, SETDATE, &onsetdate, &t);
  i2cp_set_msghandler(&t.i2cp, SESSIONSTATUS, &onsessionstatus, &t);
  i2cp_set_msghandler(&t.i2cp, REQVARLS, &onreqvarls, &t);
  i2cp_set_msghandler(&t.i2cp, PAYLOAD, &onpayload, &t);
  
  struct ev_api * api;
  assert(ev_init(&t.api));
  t.running = true;
  api = &t.api;
  t.impl = api->open();
  assert(t.impl);

  api->add(t.impl, &t.dns.ev);
  
  if(t.config.tun.enabled)
  {
    printf("open tun interface %s\n", t.config.tun.ifname);
    int tunfd = api->tun(t.impl, t.config.tun);
    if(tunfd == -1)
    {
      printf("failed to open %s\n", t.config.tun.ifname);
      return 1;
    }
    t.tun.ev.ptr = &tun_handler;
    tunif_init(&t.tun, tunfd);
    api->add(t.impl,  &t.tun.ev);
  }
  else
    printf("tun interface disabled\n");
  while(t.running)
  {
    printf("generate new identity\n");
    i2p_keygen(&t.privkey);
    i2p_privkey_dest(&t.privkey, &t.ourdest);
    char * buf = (char *) t.buf;
    i2p_dest_tob32addr(&t.ourdest, buf, sizeof(t.buf));
    printf("we are %s\n", buf);
    if(t.config.i2cp.enabled)
    {
      printf("connecting to i2p router at %s port %d\n", t.config.i2cp.addr, t.config.i2cp.port);
      if(blocking_tcp_connect(t.config.i2cp.addr, t.config.i2cp.port, &t.i2cp_fd))
      {
        t.i2cp_ev.fd = t.i2cp_fd;
        t.i2cp_ev.ptr = &i2cp_handler;
        t.i2cp_ev.flags = EV_READ;
        assert(api->add(t.impl, &t.i2cp_ev));
        i2cp_begin(&t.i2cp);
        mainloop(&t);
        api->del(t.impl, t.i2cp_fd);
      }
      else
      {
        perror("blocking_tcp_connect()");
        sleep(1);
      }
    }
    else
      mainloop(&t);
  }
  api->close(t.impl);
  i2p_crypto_end();
}